

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  int iVar1;
  Type *value;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrFieldBase local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    if (data != other_data) {
      if (*other_data != *data) {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
        return;
      }
      RepeatedPtrFieldBase::InternalSwap
                ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
      return;
    }
  }
  else {
    local_68.arena_ = (Arena *)0x0;
    local_68.current_size_ = 0;
    local_68.total_size_ = 0;
    local_68.rep_ = (Rep *)0x0;
    if (&local_68 != (RepeatedPtrFieldBase *)data) {
      if (*data == 0) {
        RepeatedPtrFieldBase::InternalSwap(&local_68,(RepeatedPtrFieldBase *)data);
      }
      else {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&local_68,(RepeatedPtrFieldBase *)data);
      }
    }
    iVar1 = (*other_mutator->_vptr_RepeatedFieldAccessor[3])(other_mutator,other_data);
    if (0 < iVar1) {
      iVar2 = 0;
      do {
        RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,iVar2);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  ((RepeatedFieldAccessor *)this,data,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar2 = iVar2 + 1;
      } while (iVar1 != iVar2);
    }
    iVar1 = (*(this->
              super_RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).super_RandomAccessRepeatedFieldAccessor.super_RepeatedFieldAccessor.
              _vptr_RepeatedFieldAccessor[3])(this,data);
    (*other_mutator->_vptr_RepeatedFieldAccessor[5])(other_mutator,other_data);
    if (0 < iVar1) {
      iVar2 = 0;
      do {
        value = RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&local_68,iVar2);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  (other_mutator,other_data,value);
        iVar2 = iVar2 + 1;
      } while (iVar1 != iVar2);
    }
    RepeatedPtrFieldBase::
    Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_68);
  }
  return;
}

Assistant:

virtual void Swap(
      Field* data,
      const internal::RepeatedFieldAccessor* other_mutator,
      Field* other_data) const {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<string>(data, other_mutator->Get<string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<string>(other_data, tmp.Get(i));
      }
    }
  }